

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

void __thiscall OpenMD::CubicSpline::addPoint(CubicSpline *this,RealType xp,RealType yp)

{
  RealType local_20;
  RealType local_18;
  
  local_20 = yp;
  local_18 = xp;
  std::vector<double,_std::allocator<double>_>::push_back(&this->x_,&local_18);
  std::vector<double,_std::allocator<double>_>::push_back(&this->y_,&local_20);
  return;
}

Assistant:

void CubicSpline::addPoint(const RealType xp, const RealType yp) {
    x_.push_back(xp);
    y_.push_back(yp);
  }